

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

void duckdb::BinaryExecutor::
     ExecuteConstant<duckdb::interval_t,duckdb::dtime_tz_t,duckdb::dtime_tz_t,duckdb::BinaryLambdaWrapper,bool,duckdb::dtime_tz_t(*)(duckdb::interval_t,duckdb::dtime_tz_t)>
               (Vector *left,Vector *right,Vector *result,
               _func_dtime_tz_t_interval_t_dtime_tz_t *fun)

{
  interval_t left_00;
  bool bVar1;
  interval_t *piVar2;
  dtime_tz_t *pdVar3;
  dtime_tz_t right_00;
  dtime_tz_t dVar4;
  Vector *in_RDX;
  Vector *in_RSI;
  dtime_tz_t *result_data;
  dtime_tz_t *rdata;
  interval_t *ldata;
  idx_t idx;
  ValidityMask *mask;
  _func_dtime_tz_t_interval_t_dtime_tz_t *in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  Vector *in_stack_ffffffffffffffd0;
  
  Vector::SetVectorType
            (in_stack_ffffffffffffffd0,(VectorType)((ulong)in_stack_ffffffffffffffc8 >> 0x38));
  piVar2 = ConstantVector::GetData<duckdb::interval_t>((Vector *)0x1fc0e41);
  pdVar3 = ConstantVector::GetData<duckdb::dtime_tz_t>((Vector *)0x1fc0e50);
  right_00.bits = (uint64_t)ConstantVector::GetData<duckdb::dtime_tz_t>((Vector *)0x1fc0e5f);
  bVar1 = ConstantVector::IsNull((Vector *)0x1fc0e6e);
  if ((!bVar1) && (bVar1 = ConstantVector::IsNull((Vector *)0x1fc0e7c), !bVar1)) {
    idx._0_4_ = piVar2->months;
    idx._4_4_ = piVar2->days;
    mask = (ValidityMask *)piVar2->micros;
    ConstantVector::Validity(in_RDX);
    left_00.micros = (int64_t)piVar2;
    left_00._0_8_ = pdVar3;
    dVar4 = BinaryLambdaWrapper::
            Operation<duckdb::dtime_tz_t(*)(duckdb::interval_t,duckdb::dtime_tz_t),bool,duckdb::interval_t,duckdb::dtime_tz_t,duckdb::dtime_tz_t>
                      (in_stack_ffffffffffffffc0,left_00,right_00,mask,idx);
    *(uint64_t *)right_00.bits = dVar4.bits;
    return;
  }
  ConstantVector::SetNull(in_RSI,SUB81((ulong)in_RDX >> 0x38,0));
  return;
}

Assistant:

static void ExecuteConstant(Vector &left, Vector &right, Vector &result, FUNC fun) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);

		auto ldata = ConstantVector::GetData<LEFT_TYPE>(left);
		auto rdata = ConstantVector::GetData<RIGHT_TYPE>(right);
		auto result_data = ConstantVector::GetData<RESULT_TYPE>(result);

		if (ConstantVector::IsNull(left) || ConstantVector::IsNull(right)) {
			ConstantVector::SetNull(result, true);
			return;
		}
		*result_data = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
		    fun, *ldata, *rdata, ConstantVector::Validity(result), 0);
	}